

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_cpp_rank_many(void **param_1)

{
  int iVar1;
  unsigned_long result;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_long> __l_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ranks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> expect_ranks;
  Roaring r1;
  allocator_type local_b1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  roaring_array_t local_68;
  unsigned_long local_38 [6];
  
  local_68.size = 0x7b;
  local_68.allocation_size = 9999;
  local_68.containers = (container_s **)0xfffffff70000270f;
  local_68.keys = (uint16_t *)CONCAT44(local_68.keys._4_4_,0xffffffff);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,__l,(allocator_type *)local_38);
  local_68.keys = (uint16_t *)0x0;
  local_68.typecodes = (uint8_t *)0x0;
  local_68.size = 0;
  local_68.allocation_size = 0;
  local_68.containers = (container_s **)0x0;
  local_68.flags = '\0';
  local_68._33_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_68,0);
  roaring_bitmap_add_many
            ((roaring_bitmap_t *)&local_68,
             (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,
             local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,
             (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)local_38);
  roaring_bitmap_rank_many
            ((roaring_bitmap_t *)&local_68,
             local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_38[2] = 2;
  local_38[3] = 3;
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[4] = 4;
  __l_00._M_len = 5;
  __l_00._M_array = local_38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_80,__l_00,&local_b1);
  if ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      result = 1;
    }
    else {
      iVar1 = bcmp(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      result = (unsigned_long)(iVar1 == 0);
    }
  }
  else {
    result = 0;
  }
  _assert_true(result,"ranks == expect_ranks",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x3d5);
  if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (uint64_t *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  roaring::Roaring::~Roaring((Roaring *)&local_68);
  if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_cpp_rank_many) {
    std::vector<uint32_t> values = {123, 9999, 9999, 0xFFFFFFF7, 0xFFFFFFFF};
    Roaring r1;
    r1.addMany(values.size(), values.data());

    std::vector<uint64_t> ranks(values.size());
    r1.rank_many(values.data(), values.data() + values.size(), ranks.data());
    std::vector<uint64_t> expect_ranks{1, 2, 2, 3, 4};
    assert_true(ranks == expect_ranks);
}